

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestList
               (ostream *stream,
               vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  ostream *poVar1;
  pointer ppTVar2;
  size_t width;
  int value;
  size_t i;
  ulong uVar3;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string kIndent;
  string kTestsuites;
  string local_48;
  
  std::__cxx11::string::string((string *)&kTestsuites,"testsuites",(allocator *)&kIndent);
  Indent_abi_cxx11_(&kIndent,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  value = 0;
  for (ppTVar2 = (test_suites->
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar2 !=
      (test_suites->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish; ppTVar2 = ppTVar2 + 1) {
    value = value + (int)((ulong)((long)((*ppTVar2)->test_info_list_).
                                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)((*ppTVar2)->test_info_list_).
                                       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  std::__cxx11::string::string((string *)&local_a8,"tests",(allocator *)&local_48);
  OutputJsonKey(stream,&kTestsuites,&local_a8,value,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"name",&local_a9);
  std::__cxx11::string::string((string *)&local_48,"AllTests",&local_aa);
  OutputJsonKey(stream,&kTestsuites,&local_a8,&local_48,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  poVar1 = std::operator<<(stream,(string *)&kIndent);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,(string *)&kTestsuites);
  std::operator<<(poVar1,"\": [\n");
  for (uVar3 = 0;
      ppTVar2 = (test_suites->
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(test_suites->
                            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3);
      uVar3 = uVar3 + 1) {
    if (uVar3 != 0) {
      std::operator<<(stream,",\n");
      ppTVar2 = (test_suites->
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    }
    PrintJsonTestSuite(stream,ppTVar2[uVar3]);
  }
  poVar1 = std::operator<<(stream,"\n");
  poVar1 = std::operator<<(poVar1,(string *)&kIndent);
  poVar1 = std::operator<<(poVar1,"]\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::~string((string *)&kIndent);
  std::__cxx11::string::~string((string *)&kTestsuites);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestList(
    std::ostream* stream, const std::vector<TestSuite*>& test_suites) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";
  int total_tests = 0;
  for (auto test_suite : test_suites) {
    total_tests += test_suite->total_test_count();
  }
  OutputJsonKey(stream, kTestsuites, "tests", total_tests, kIndent);

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  for (size_t i = 0; i < test_suites.size(); ++i) {
    if (i != 0) {
      *stream << ",\n";
    }
    PrintJsonTestSuite(stream, *test_suites[i]);
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}